

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_threads.c
# Opt level: O2

int zt_threadpool_set_callbacks(zt_threadpool_callbacks *cbs)

{
  if (cbs == (zt_threadpool_callbacks *)0x0) {
    _zt_threadpool_cbs.iput_loop = _zt_threadpool_iput_loop;
    _zt_threadpool_cbs.oput_loop = _zt_threadpool_oput_loop;
    _zt_threadpool_cbs.init = (_func_void_ptr_void_ptr *)0x0;
    _zt_threadpool_cbs.iput_worker = (_func_void_ptr_void_ptr_void_ptr *)0x0;
    _zt_threadpool_cbs.oput_worker = (_func_void_ptr_void_ptr_void_ptr *)0x0;
  }
  else {
    if (cbs->iput_loop != (_func_void_ptr_void_ptr *)0x0) {
      _zt_threadpool_cbs.iput_loop = cbs->iput_loop;
    }
    if (cbs->oput_loop != (_func_void_ptr_void_ptr *)0x0) {
      _zt_threadpool_cbs.oput_loop = cbs->oput_loop;
    }
    if (cbs->init != (_func_void_ptr_void_ptr *)0x0) {
      _zt_threadpool_cbs.init = cbs->init;
    }
    if (cbs->iput_worker != (_func_void_ptr_void_ptr_void_ptr *)0x0) {
      _zt_threadpool_cbs.iput_worker = cbs->iput_worker;
    }
    if (cbs->oput_worker != (_func_void_ptr_void_ptr_void_ptr *)0x0) {
      _zt_threadpool_cbs.oput_worker = cbs->oput_worker;
    }
    if (cbs->finalize != (_func_void_void_ptr_void_ptr *)0x0) {
      _zt_threadpool_cbs.finalize = cbs->finalize;
    }
  }
  return 0;
}

Assistant:

int
zt_threadpool_set_callbacks(struct zt_threadpool_callbacks *cbs) {
    if (cbs == NULL) {
        /* set our defaults */
        _zt_threadpool_cbs.iput_loop   = _zt_threadpool_iput_loop;
        _zt_threadpool_cbs.oput_loop   = _zt_threadpool_oput_loop;
        _zt_threadpool_cbs.init        = NULL;
        _zt_threadpool_cbs.iput_worker = NULL;
        _zt_threadpool_cbs.oput_worker = NULL;

        return 0;
    }


    if (cbs->iput_loop) {
        _zt_threadpool_cbs.iput_loop = cbs->iput_loop;
    }

    if (cbs->oput_loop) {
        _zt_threadpool_cbs.oput_loop = cbs->oput_loop;
    }

    if (cbs->init) {
        _zt_threadpool_cbs.init = cbs->init;
    }

    if (cbs->iput_worker) {
        _zt_threadpool_cbs.iput_worker = cbs->iput_worker;
    }

    if (cbs->oput_worker) {
        _zt_threadpool_cbs.oput_worker = cbs->oput_worker;
    }

    if (cbs->finalize) {
        _zt_threadpool_cbs.finalize = cbs->finalize;
    }

    return 0;
}